

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O1

_Bool iterator_descend(Iterator *self,uint32_t goal_position)

{
  uint32_t uVar1;
  uint uVar2;
  undefined4 uVar3;
  SubtreeHeapData *pSVar4;
  Subtree *pSVar5;
  SubtreeHeapData *pSVar6;
  uint uVar7;
  undefined4 uVar8;
  byte bVar9;
  bool bVar10;
  int iVar12;
  TreeCursorEntry *pTVar13;
  ulong uVar14;
  Iterator *self_00;
  Iterator *extraout_RAX;
  ulong extraout_RAX_00;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint32_t uVar21;
  Subtree *pSVar22;
  uint uVar23;
  uint32_t uVar24;
  Length result;
  int iStack_114;
  uint32_t uStack_110;
  int iStack_f0;
  undefined4 uStack_ec;
  uint32_t local_9c;
  uint32_t local_8c;
  undefined4 uStack_84;
  uint32_t uStack_80;
  Iterator *local_78;
  undefined8 local_70;
  int local_68;
  undefined4 uStack_54;
  _Bool _Var11;
  
  if (self->in_padding == false) {
    do {
      uVar21 = (self->cursor).stack.size;
      if (uVar21 == 0) {
        __assert_fail("(uint32_t)(&self->cursor.stack)->size - 1 < (&self->cursor.stack)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/get_changed_ranges.c"
                      ,0xca,"_Bool iterator_descend(Iterator *, uint32_t)");
      }
      uVar2 = uVar21 - 1;
      pTVar13 = (self->cursor).stack.contents;
      pSVar22 = pTVar13[uVar2].subtree;
      pSVar4 = pSVar22->ptr;
      uVar14 = 0;
      if (((ulong)pSVar4 & 1) == 0) {
        uVar14 = (ulong)pSVar4->child_count;
      }
      uVar21 = 0;
      if ((int)uVar14 == 0) {
        bVar10 = true;
      }
      else {
        local_70._0_4_ = pTVar13[uVar2].position.bytes;
        local_70._4_4_ = pTVar13[uVar2].position.extent.row;
        local_9c = pTVar13[uVar2].position.extent.column;
        lVar18 = 0;
        bVar9 = 0;
        local_8c = 0;
        do {
          pSVar5 = (pSVar22->ptr->field_17).field_0.children;
          uVar19 = *(ulong *)((long)pSVar5 + lVar18);
          if ((uVar19 & 1) == 0) {
            uVar15 = (uint)*(undefined8 *)(uVar19 + 4);
            uVar16 = (uint)((ulong)*(undefined8 *)(uVar19 + 4) >> 0x20);
            uVar2 = *(uint *)(uVar19 + 0xc);
          }
          else {
            uVar15 = (uint)(uVar19 >> 0x10) & 0xff;
            uVar2 = (uint)(uVar19 >> 0x20);
            uVar16 = uVar2 >> 8 & 0xf;
            uVar2 = uVar2 & 0xff;
          }
          uStack_54 = (undefined4)((ulong)local_70 >> 0x20);
          uVar15 = uVar15 + (int)local_70;
          uVar17 = CONCAT44(local_9c,uStack_54) + CONCAT44(uVar2,uVar16);
          uVar20 = uVar17 & 0xffffffff | (ulong)uVar2 << 0x20;
          if (uVar16 == 0) {
            uVar20 = uVar17;
          }
          if ((uVar19 & 1) == 0) {
            uVar17 = *(ulong *)(uVar19 + 0x10);
            iVar12 = (int)(uVar17 >> 0x20);
            uVar2 = *(uint *)(uVar19 + 0x18);
          }
          else {
            uVar17 = uVar19 >> 0x18 & 0xff;
            uVar2 = (uint)uVar17;
            iVar12 = 0;
          }
          local_68 = (int)uVar17;
          uVar20 = uVar20 + CONCAT44(uVar2,iVar12);
          uVar16 = local_68 + uVar15;
          uVar17 = uVar20 & 0xffffffff | (ulong)uVar2 << 0x20;
          if (iVar12 == 0) {
            uVar17 = uVar20;
          }
          uStack_84 = (undefined4)uVar17;
          uStack_80 = (uint32_t)(uVar17 >> 0x20);
          if (goal_position < uVar16) {
            uVar2 = (self->cursor).stack.capacity;
            if ((self->cursor).stack.size == uVar2) {
              uVar7 = uVar2 * 2;
              if (uVar2 * 2 < 9) {
                uVar7 = 8;
              }
              local_78 = (Iterator *)(ulong)uVar7;
              if (uVar2 < uVar7) {
                pTVar13 = (self->cursor).stack.contents;
                if (pTVar13 == (TreeCursorEntry *)0x0) {
                  pTVar13 = (TreeCursorEntry *)calloc((size_t)local_78,0x20);
                  if (pTVar13 != (TreeCursorEntry *)0x0) goto LAB_00128083;
                }
                else {
                  local_78 = (Iterator *)((long)local_78 << 5);
                  pTVar13 = (TreeCursorEntry *)realloc(pTVar13,(size_t)local_78);
                  if (pTVar13 != (TreeCursorEntry *)0x0) {
LAB_00128083:
                    (self->cursor).stack.contents = pTVar13;
                    (self->cursor).stack.capacity = uVar7;
                    goto LAB_00128090;
                  }
                  iterator_descend_cold_1();
                }
                iterator_descend_cold_2();
                if (local_78->in_padding == false) goto LAB_001281d8;
                local_78->in_padding = false;
                _Var11 = iterator_tree_is_visible(local_78);
                uVar14 = (ulong)_Var11;
                if (!_Var11) goto LAB_00128419;
                goto LAB_001281d0;
              }
            }
LAB_00128090:
            pTVar13 = (self->cursor).stack.contents;
            uVar2 = (self->cursor).stack.size;
            (self->cursor).stack.size = uVar2 + 1;
            pTVar13[uVar2].subtree = (Subtree *)((long)pSVar5 + lVar18);
            pTVar13[uVar2].position.bytes = (undefined4)local_70;
            pTVar13[uVar2].position.extent.row = local_70._4_4_;
            pTVar13[uVar2].position.extent.column = local_9c;
            pTVar13[uVar2].child_index = uVar21;
            pTVar13[uVar2].structural_child_index = local_8c;
            _Var11 = iterator_tree_is_visible(self);
            if (_Var11) {
              if (goal_position < uVar15) {
                self->in_padding = true;
              }
              else {
                self->visible_depth = self->visible_depth + 1;
              }
              iVar12 = 1;
            }
            else {
              bVar9 = 1;
              iVar12 = 4;
            }
          }
          else {
            if ((uVar19 & 1) == 0) {
              uVar2 = *(uint *)(uVar19 + 0x2c) >> 2;
            }
            else {
              uVar2 = (uint)uVar19 >> 3;
            }
            local_9c = uStack_80;
            local_8c = local_8c + ((uVar2 & 1) == 0);
            iVar12 = 0;
            local_70 = CONCAT44(uStack_84,uVar16);
          }
          if (goal_position < uVar16) goto LAB_00128141;
          uVar21 = uVar21 + 1;
          lVar18 = lVar18 + 8;
        } while (uVar14 << 3 != lVar18);
        iVar12 = 4;
LAB_00128141:
        uVar21 = (uint32_t)(iVar12 != 4);
        bVar10 = (bool)(bVar9 ^ 1);
      }
      _Var11 = SUB41(uVar21,0);
    } while ((_Var11 == false) && (!bVar10));
  }
  else {
    _Var11 = false;
  }
  return _Var11;
  while( true ) {
    pSVar4 = (pTVar13[uVar2 - 2].subtree)->ptr;
    uVar2 = 0;
    if (((ulong)pSVar4 & 1) == 0) {
      uVar2 = pSVar4->child_count;
    }
    uVar16 = pTVar13[uVar15].child_index + 1;
    if (uVar16 < uVar2) break;
LAB_001281d8:
    _Var11 = iterator_tree_is_visible(local_78);
    if (_Var11) {
      local_78->visible_depth = local_78->visible_depth - 1;
    }
    pTVar13 = (local_78->cursor).stack.contents;
    uVar2 = (local_78->cursor).stack.size;
    uVar14 = (ulong)uVar2;
    uVar15 = uVar2 - 1;
    (local_78->cursor).stack.size = uVar15;
    if (uVar15 == 0) goto LAB_00128441;
  }
  pSVar6 = (pTVar13[uVar15].subtree)->ptr;
  if (((ulong)pSVar6 & 1) == 0) {
    uVar2 = (pSVar6->padding).bytes;
    uVar7 = (pSVar6->padding).extent.row;
    uVar21 = (pSVar6->padding).extent.column;
  }
  else {
    uVar2 = (uint)((ulong)pSVar6 >> 0x10) & 0xff;
    uVar23 = (uint)((ulong)pSVar6 >> 0x20);
    uVar7 = uVar23 >> 8 & 0xf;
    uVar21 = uVar23 & 0xff;
  }
  uVar3 = pTVar13[uVar15].position.bytes;
  uVar8 = pTVar13[uVar15].position.extent.row;
  if (((ulong)pSVar6 & 1) == 0) {
    uVar14._0_4_ = (pSVar6->size).bytes;
    uVar14._4_4_ = (pSVar6->size).extent.row;
    uVar24 = (pSVar6->size).extent.column;
    iVar12 = uVar14._4_4_;
  }
  else {
    uVar14 = (ulong)pSVar6 >> 0x18 & 0xff;
    uVar24 = (uint32_t)uVar14;
    iVar12 = 0;
  }
  uVar1 = pTVar13[uVar15].structural_child_index;
  uVar20 = CONCAT44(uVar21,uVar7) + CONCAT44(uVar24,iVar12);
  uVar19 = uVar20 & 0xffffffff | (ulong)uVar24 << 0x20;
  if (iVar12 == 0) {
    uVar19 = uVar20;
  }
  iStack_114 = (int)uVar19;
  uVar20 = CONCAT44(pTVar13[uVar15].position.extent.column,uVar8) + uVar19;
  uVar19 = uVar20 & 0xffffffff | uVar19 & 0xffffffff00000000;
  if (iStack_114 == 0) {
    uVar19 = uVar20;
  }
  iStack_114 = (int)uVar19;
  uStack_110 = (uint32_t)(uVar19 >> 0x20);
  if (((ulong)pSVar6 & 1) == 0) {
    uVar15 = *(uint *)&pSVar6->field_0x2c >> 2;
  }
  else {
    uVar15 = (uint)pSVar6 >> 3;
  }
  pSVar22 = (pSVar4->field_17).field_0.children + uVar16;
  uVar7 = (local_78->cursor).stack.capacity;
  if ((local_78->cursor).stack.size != uVar7) goto LAB_001283d5;
  uVar23 = 8;
  if (8 < uVar7 * 2) {
    uVar23 = uVar7 * 2;
  }
  if (uVar23 <= uVar7) goto LAB_001283d5;
  self_00 = (Iterator *)(ulong)uVar23;
  if (pTVar13 == (TreeCursorEntry *)0x0) {
LAB_001283ad:
    pTVar13 = (TreeCursorEntry *)calloc((size_t)self_00,0x20);
    if (pTVar13 == (TreeCursorEntry *)0x0) {
      iterator_advance_cold_2();
      uVar14 = extraout_RAX_00;
      if ((self_00->cursor).stack.size != 0) {
        _Var11 = iterator_tree_is_visible(self_00);
        if ((_Var11) && (self_00->in_padding == false)) {
          self_00->visible_depth = self_00->visible_depth - 1;
        }
        uVar21 = (self_00->cursor).stack.size;
        if (uVar21 == 0) {
          __assert_fail("(uint32_t)(&self->cursor.stack)->size - 1 < (&self->cursor.stack)->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/get_changed_ranges.c"
                        ,0xc0,"void iterator_ascend(Iterator *)");
        }
        uVar2 = uVar21 - 1;
        uVar14 = (ulong)uVar2;
        if ((self_00->cursor).stack.contents[uVar14].child_index != 0) {
          self_00->in_padding = false;
        }
        (self_00->cursor).stack.size = uVar2;
      }
      return SUB81(uVar14,0);
    }
  }
  else {
    pTVar13 = (TreeCursorEntry *)realloc(pTVar13,(long)self_00 << 5);
    if (pTVar13 == (TreeCursorEntry *)0x0) {
      iterator_advance_cold_1();
      self_00 = extraout_RAX;
      goto LAB_001283ad;
    }
  }
  (local_78->cursor).stack.contents = pTVar13;
  (local_78->cursor).stack.capacity = uVar23;
LAB_001283d5:
  pTVar13 = (local_78->cursor).stack.contents;
  uVar7 = (local_78->cursor).stack.size;
  (local_78->cursor).stack.size = uVar7 + 1;
  pTVar13[uVar7].subtree = pSVar22;
  pTVar13[uVar7].position.bytes = (int)uVar14 + uVar2 + uVar3;
  pTVar13[uVar7].position.extent.row = iStack_114;
  pTVar13[uVar7].position.extent.column = uStack_110;
  pTVar13[uVar7].child_index = uVar16;
  pTVar13[uVar7].structural_child_index = uVar1 + ((uVar15 & 1) == 0);
  _Var11 = iterator_tree_is_visible(local_78);
  if (!_Var11) {
LAB_00128419:
    _Var11 = iterator_descend(local_78,0);
    return _Var11;
  }
  pSVar4 = pSVar22->ptr;
  if (((ulong)pSVar4 & 1) == 0) {
    uVar14 = (ulong)(pSVar4->padding).bytes;
  }
  else {
    uVar14 = (ulong)pSVar4 >> 0x10 & 0xff;
  }
  if (uVar14 == 0) {
LAB_001281d0:
    local_78->visible_depth = local_78->visible_depth + 1;
  }
  else {
    local_78->in_padding = true;
  }
LAB_00128441:
  return SUB81(uVar14,0);
}

Assistant:

static bool iterator_descend(Iterator *self, uint32_t goal_position) {
  if (self->in_padding) return false;

  bool did_descend;
  do {
    did_descend = false;
    TreeCursorEntry entry = *array_back(&self->cursor.stack);
    Length position = entry.position;
    uint32_t structural_child_index = 0;
    for (uint32_t i = 0, n = ts_subtree_child_count(*entry.subtree); i < n; i++) {
      const Subtree *child = &entry.subtree->ptr->children[i];
      Length child_left = length_add(position, ts_subtree_padding(*child));
      Length child_right = length_add(child_left, ts_subtree_size(*child));

      if (child_right.bytes > goal_position) {
        array_push(&self->cursor.stack, ((TreeCursorEntry){
          .subtree = child,
          .position = position,
          .child_index = i,
          .structural_child_index = structural_child_index,
        }));

        if (iterator_tree_is_visible(self)) {
          if (child_left.bytes > goal_position) {
            self->in_padding = true;
          } else {
            self->visible_depth++;
          }
          return true;
        }

        did_descend = true;
        break;
      }

      position = child_right;
      if (!ts_subtree_extra(*child)) structural_child_index++;
    }
  } while (did_descend);

  return false;
}